

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

bool __thiscall
QXmlStreamReaderPrivate::scanUntil(QXmlStreamReaderPrivate *this,char *str,short tokenToInject)

{
  QString *this_00;
  qsizetype from;
  qint64 qVar1;
  long lVar2;
  bool bVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  QChar ch;
  uint uVar7;
  long in_FS_OFFSET;
  QStringView s;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->textBuffer;
  from = (this->textBuffer).d.size;
  qVar1 = this->lineNumber;
LAB_0039165a:
  do {
    lVar5 = (this->putStack).tos;
    if (lVar5 != -1) {
      if (this->atEnd == false) {
        uVar7 = (this->putStack).data[lVar5];
        (this->putStack).tos = lVar5 + -1;
        goto LAB_003916bf;
      }
LAB_0039186c:
      s.m_data = (this->textBuffer).d.ptr;
      s.m_size = (this->textBuffer).d.size;
      putString(this,s,from);
      QString::resize(this_00,from);
LAB_00391895:
      this->lineNumber = qVar1;
      bVar3 = false;
      goto LAB_003918a3;
    }
    lVar5 = this->readBufferPos;
    if (lVar5 < (this->readBuffer).d.size) {
      this->readBufferPos = lVar5 + 1;
      uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar5];
    }
    else {
      uVar7 = getChar_helper(this);
    }
LAB_003916bf:
    if ((int)uVar7 < 10) {
      ch.ucs = L'\t';
      if (uVar7 != 9) {
        if (uVar7 != 0xffffffff) goto LAB_00391702;
        goto LAB_0039186c;
      }
LAB_0039185f:
      QString::append(this_00,ch);
      goto LAB_0039165a;
    }
    if (uVar7 == 10) {
LAB_0039183f:
      this->lineNumber = this->lineNumber + 1;
      this->lastLineStart = this->readBufferPos + this->characterOffset;
      ch.ucs = L'\n';
      goto LAB_0039185f;
    }
    if (uVar7 == 0xd) {
      lVar5 = (this->putStack).tos;
      if (lVar5 == -1) {
        if (this->readBufferPos < (this->readBuffer).d.size) {
          uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
          goto LAB_0039176b;
        }
        uVar7 = getChar_helper(this);
        if (uVar7 != 0xffffffff) {
          this->readBufferPos = this->readBufferPos + -1;
          goto LAB_0039176b;
        }
      }
      else {
        uVar7 = (this->putStack).data[lVar5];
LAB_0039176b:
        if (uVar7 != 0xffffffff) {
          if (uVar7 == 10) {
            lVar5 = (this->putStack).tos;
            if (lVar5 == -1) {
              this->readBufferPos = this->readBufferPos + 1;
            }
            else {
              (this->putStack).tos = lVar5 + -1;
            }
          }
          goto LAB_0039183f;
        }
      }
      puVar4 = (this->putStack).data;
      lVar6 = (this->putStack).tos;
      lVar5 = lVar6 + 1;
      lVar2 = (this->putStack).cap;
      if (lVar5 < lVar2) {
LAB_003917f2:
        (this->putStack).tos = lVar5;
        puVar4[lVar5] = 0xd;
        uVar7 = 0;
        goto LAB_00391803;
      }
      lVar6 = lVar6 + 2;
      lVar5 = lVar2 * 2;
      if (lVar6 != lVar5 && SBORROW8(lVar6,lVar5) == lVar6 + lVar2 * -2 < 0) {
        lVar5 = lVar6;
      }
      (this->putStack).cap = lVar5;
      puVar4 = (uint *)realloc(puVar4,lVar5 << 2);
      (this->putStack).data = puVar4;
      if (puVar4 != (uint *)0x0) {
        lVar5 = (this->putStack).tos + 1;
        goto LAB_003917f2;
      }
LAB_003919bf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_003919d4;
    }
LAB_00391702:
    if (((uVar7 < 0x20) || (0x10ffff < uVar7)) || ((uVar7 & 0xfffffffe) == 0xfffe)) {
      QCoreApplication::translate(&local_50,"QXmlStream","Invalid XML character.",(char *)0x0,-1);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,&local_50);
      this->type = Invalid;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_00391895;
    }
    QString::append(this_00,(QChar)(char16_t)uVar7);
LAB_00391803:
    if (uVar7 == (int)*str) {
      if (str[1] == '\0') {
        bVar3 = true;
        if (-1 < tokenToInject) {
          puVar4 = (this->putStack).data;
          lVar6 = (this->putStack).tos;
          lVar5 = lVar6 + 1;
          lVar2 = (this->putStack).cap;
          if (lVar2 <= lVar5) {
            lVar6 = lVar6 + 2;
            lVar5 = lVar2 * 2;
            if (lVar6 != lVar5 && SBORROW8(lVar6,lVar5) == lVar6 + lVar2 * -2 < 0) {
              lVar5 = lVar6;
            }
            (this->putStack).cap = lVar5;
            puVar4 = (uint *)realloc(puVar4,lVar5 << 2);
            (this->putStack).data = puVar4;
            if (puVar4 == (uint *)0x0) goto LAB_003919bf;
            lVar5 = (this->putStack).tos + 1;
          }
          (this->putStack).tos = lVar5;
          puVar4[lVar5] = (uint)(ushort)tokenToInject << 0x10;
        }
        goto LAB_003918a3;
      }
      bVar3 = scanString(this,str + 1,tokenToInject,false);
      if (bVar3) {
        bVar3 = true;
LAB_003918a3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return bVar3;
        }
LAB_003919d4:
        __stack_chk_fail();
      }
    }
  } while( true );
}

Assistant:

bool QXmlStreamReaderPrivate::scanUntil(const char *str, short tokenToInject)
{
    const qsizetype pos = textBuffer.size();
    const auto oldLineNumber = lineNumber;

    uint c;
    while ((c = getChar()) != StreamEOF) {
        /* First, we do the validation & normalization. */
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                break;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case '\t':
            textBuffer += QChar(c);
            continue;
        default:
            if (c < 0x20 || (c > 0xFFFD && c < 0x10000) || c > QChar::LastValidCodePoint ) {
                raiseWellFormedError(QXmlStream::tr("Invalid XML character."));
                lineNumber = oldLineNumber;
                return false;
            }
            textBuffer += QChar(c);
        }


        /* Second, attempt to lookup str. */
        if (c == uint(*str)) {
            if (!*(str + 1)) {
                if (tokenToInject >= 0)
                    injectToken(tokenToInject);
                return true;
            } else {
                if (scanString(str + 1, tokenToInject, false))
                    return true;
            }
        }
    }
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    lineNumber = oldLineNumber;
    return false;
}